

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

void __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::PromiseClient::resolve
          (PromiseClient *this,Own<capnp::ClientHook> *replacement,bool isError)

{
  ExportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo> *pEVar1;
  RpcConnectionState *pRVar2;
  undefined8 *puVar3;
  ClientHook *pCVar4;
  uint *puVar5;
  Embargo *pEVar6;
  Embargo *pEVar7;
  ArrayDisposer *pAVar8;
  Disposer *pDVar9;
  PromiseFulfiller<void> *pPVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  SegmentBuilder *pSVar14;
  CapTableBuilder *pCVar15;
  WirePointer *pWVar16;
  long *plVar17;
  int iVar18;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SegmentBuilder *pSVar19;
  TransformPromiseNodeBase *this_00;
  SegmentBuilder *pSVar20;
  SegmentBuilder *pSVar21;
  Embargo *pEVar22;
  Own<kj::PromiseFulfiller<void>_> *pOVar23;
  Own<capnp::ClientHook> OVar24;
  Fault f;
  Maybe<kj::Own<capnp::ClientHook>_> redirect;
  PromiseForResult<kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_c__:986:40),_kj::Own<capnp::ClientHook>_>,_void>
  embargoPromise;
  Own<capnp::OutgoingRpcMessage> message;
  Builder disembargo;
  StructBuilder local_108;
  undefined8 local_d8;
  undefined8 uStack_d0;
  WirePointer *local_c8;
  SegmentBuilder *local_c0;
  PointerBuilder local_b8;
  undefined8 *local_a0;
  long *local_98;
  ExportTable<unsigned_int,_capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo> *local_90;
  StructBuilder local_88;
  StructBuilder local_58;
  
  iVar18 = (*replacement->ptr->_vptr_ClientHook[5])();
  pRVar2 = (this->super_RpcClient).connectionState.ptr;
  if ((((RpcConnectionState *)CONCAT44(extraout_var,iVar18) !=
        (RpcConnectionState *)&ClientHook::NULL_CAPABILITY_BRAND &&
        (RpcConnectionState *)CONCAT44(extraout_var,iVar18) != pRVar2) &&
      (this->receivedCall == true && !isError)) && ((pRVar2->connection).tag == 1)) {
    puVar3 = *(undefined8 **)((long)&(pRVar2->connection).field_1 + 8);
    (**(code **)*puVar3)(&local_a0,puVar3,0x19);
    (**(code **)*local_98)(&local_d8);
    local_b8.pointer = local_c8;
    local_b8.segment = local_d8;
    local_b8.capTable = (CapTableBuilder *)uStack_d0;
    PointerBuilder::initStruct(&local_108,&local_b8,(StructSize)0x10001);
    *(undefined2 *)(Disposer **)local_108.data = 0xd;
    local_b8.segment = local_108.segment;
    local_b8.capTable = local_108.capTable;
    local_b8.pointer = local_108.pointers;
    PointerBuilder::initStruct(&local_88,&local_b8,(StructSize)0x10001);
    pRVar2 = (this->super_RpcClient).connectionState.ptr;
    pCVar4 = (this->cap).ptr;
    local_108.segment = local_88.segment;
    local_108.capTable = local_88.capTable;
    local_108.data = local_88.pointers;
    PointerBuilder::initStruct(&local_58,(PointerBuilder *)&local_108,(StructSize)0x10001);
    local_108.dataSize = local_58.dataSize;
    local_108.pointerCount = local_58.pointerCount;
    local_108._38_2_ = local_58._38_2_;
    local_108.data = (void *)CONCAT44(local_58.data._4_4_,local_58.data._0_4_);
    local_108.pointers._0_4_ = local_58.pointers._0_4_;
    local_108.pointers._4_4_ = local_58.pointers._4_4_;
    local_108.segment = (SegmentBuilder *)CONCAT44(local_58.segment._4_4_,local_58.segment._0_4_);
    local_108.capTable =
         (CapTableBuilder *)CONCAT44(local_58.capTable._4_4_,local_58.capTable._0_4_);
    iVar18 = (*pCVar4->_vptr_ClientHook[5])(pCVar4);
    if ((RpcConnectionState *)CONCAT44(extraout_var_00,iVar18) == pRVar2) {
      (*pCVar4->_vptr_ClientHook[8])(&local_d8);
    }
    else {
      (*pCVar4->_vptr_ClientHook[4])(&local_b8);
      local_d8 = local_b8.segment;
      uStack_d0 = (SegmentBuilder *)local_b8.capTable;
    }
    if (uStack_d0 != (SegmentBuilder *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[67]>
                ((Fault *)&local_108,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0x3cd,FAILED,"redirect == nullptr",
                 "\"Original promise target should always be from this RPC connection.\"",
                 (char (*) [67])"Original promise target should always be from this RPC connection."
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_108);
    }
    pRVar2 = (this->super_RpcClient).connectionState.ptr;
    pEVar1 = &pRVar2->embargoes;
    puVar5 = (pRVar2->embargoes).freeIds.c.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar5 == (pRVar2->embargoes).freeIds.c.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pSVar19 = (SegmentBuilder *)(pRVar2->embargoes).slots.builder.ptr;
      pSVar21 = (SegmentBuilder *)(pRVar2->embargoes).slots.builder.pos;
      pSVar20 = (SegmentBuilder *)((long)pSVar21 - (long)pSVar19 >> 4);
      local_90 = pEVar1;
      if (pSVar21 == (SegmentBuilder *)(pRVar2->embargoes).slots.builder.endPtr) {
        local_c0 = (SegmentBuilder *)0x4;
        if (pSVar21 != pSVar19) {
          local_c0 = (SegmentBuilder *)((long)pSVar21 - (long)pSVar19 >> 3);
        }
        if (local_c0 < pSVar20) {
          pSVar19 = (SegmentBuilder *)
                    ((Own<kj::PromiseFulfiller<void>_> *)&(pSVar19->super_SegmentReader).arena +
                    (long)local_c0);
          while (pSVar14 = pSVar21, pSVar19 < pSVar14) {
            (pRVar2->embargoes).slots.builder.pos =
                 (RemoveConst<capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo> *)
                 &pSVar14[-1].pos;
            pSVar21 = (SegmentBuilder *)&pSVar14[-1].pos;
            if (*(long *)&pSVar14[-1].readOnly != 0) {
              *(undefined8 *)&pSVar14[-1].readOnly = 0;
              (**(code **)(pSVar14[-1].pos)->content)();
              pSVar21 = (SegmentBuilder *)(pRVar2->embargoes).slots.builder.pos;
            }
          }
        }
        pSVar19 = local_c0;
        local_108.segment =
             (SegmentBuilder *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (0x10,0,(size_t)local_c0,(_func_void_void_ptr *)0x0,
                        (_func_void_void_ptr *)0x0);
        pOVar23 = (Own<kj::PromiseFulfiller<void>_> *)
                  &((local_108.segment)->super_SegmentReader).arena + (long)pSVar19;
        local_108.pointers._0_4_ = 0x62dee8;
        local_108.pointers._4_4_ = 0;
        pEVar7 = (pRVar2->embargoes).slots.builder.pos;
        pEVar6 = (pRVar2->embargoes).slots.builder.ptr;
        pSVar21 = local_108.segment;
        for (pEVar22 = pEVar6; pEVar22 != pEVar7; pEVar22 = pEVar22 + 1) {
          pPVar10 = (pEVar22->fulfiller).ptr.ptr;
          ((Own<kj::PromiseFulfiller<void>_> *)&(pSVar21->super_SegmentReader).arena)->disposer =
               (pEVar22->fulfiller).ptr.disposer;
          *(PromiseFulfiller<void> **)&(pSVar21->super_SegmentReader).id.value = pPVar10;
          (pEVar22->fulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
          pSVar21 = (SegmentBuilder *)&(pSVar21->super_SegmentReader).ptr;
        }
        pSVar19 = local_108.segment;
        local_108.capTable = (CapTableBuilder *)pSVar21;
        local_108.data = pOVar23;
        if (pEVar6 != (Embargo *)0x0) {
          pEVar22 = (pRVar2->embargoes).slots.builder.endPtr;
          (local_90->slots).builder.ptr = (Embargo *)0x0;
          (local_90->slots).builder.pos =
               (RemoveConst<capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo> *)0x0;
          (local_90->slots).builder.endPtr = (Embargo *)0x0;
          pAVar8 = (pRVar2->embargoes).slots.builder.disposer;
          local_c0 = local_108.segment;
          (**pAVar8->_vptr_ArrayDisposer)
                    (pAVar8,pEVar6,0x10,(long)pEVar7 - (long)pEVar6 >> 4,
                     (long)pEVar22 - (long)pEVar6 >> 4,
                     kj::ArrayDisposer::
                     Dispose_<capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo,_false>::
                     destruct);
          pSVar19 = local_c0;
        }
        (pRVar2->embargoes).slots.builder.ptr = (Embargo *)pSVar19;
        (pRVar2->embargoes).slots.builder.pos =
             (RemoveConst<capnp::_::(anonymous_namespace)::RpcConnectionState::Embargo> *)pSVar21;
        (pRVar2->embargoes).slots.builder.endPtr = (Embargo *)pOVar23;
        (pRVar2->embargoes).slots.builder.disposer =
             (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      }
      ((Own<kj::PromiseFulfiller<void>_> *)&(pSVar21->super_SegmentReader).arena)->disposer =
           (Disposer *)0x0;
      *(PromiseFulfiller<void> **)&(pSVar21->super_SegmentReader).id.value =
           (PromiseFulfiller<void> *)0x0;
      pEVar22 = (pRVar2->embargoes).slots.builder.pos;
      (pRVar2->embargoes).slots.builder.pos = pEVar22 + 1;
    }
    else {
      pSVar20 = (SegmentBuilder *)(ulong)*puVar5;
      std::
      priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
      ::pop(&(pRVar2->embargoes).freeIds);
      pEVar22 = (pEVar1->slots).builder.ptr + (long)pSVar20;
    }
    *(undefined2 *)((long)local_88.data + 4) = 0;
    *(int *)local_88.data = (int)pSVar20;
    kj::newPromiseAndFulfiller<void>();
    uVar12 = local_108.pointers._4_4_;
    uVar11 = local_108.pointers._0_4_;
    pDVar9 = (pEVar22->fulfiller).ptr.disposer;
    local_108.pointers = (WirePointer *)0x0;
    pPVar10 = (pEVar22->fulfiller).ptr.ptr;
    *(undefined4 *)&(pEVar22->fulfiller).ptr.disposer = local_108.data._0_4_;
    *(undefined4 *)((long)&(pEVar22->fulfiller).ptr.disposer + 4) = local_108.data._4_4_;
    *(undefined4 *)&(pEVar22->fulfiller).ptr.ptr = uVar11;
    *(undefined4 *)((long)&(pEVar22->fulfiller).ptr.ptr + 4) = uVar12;
    if (pPVar10 != (PromiseFulfiller<void> *)0x0) {
      (**pDVar9->_vptr_Disposer)
                (pDVar9,(_func_int *)
                        ((long)&pPVar10->_vptr_PromiseFulfiller +
                        (long)pPVar10->_vptr_PromiseFulfiller[-2]));
    }
    pDVar9 = replacement->disposer;
    pCVar4 = replacement->ptr;
    replacement->ptr = (ClientHook *)0x0;
    this_00 = (TransformPromiseNodeBase *)operator_new(0x40);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(Own<kj::_::PromiseNode> *)&local_108,
               kj::
               CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:986:40),_kj::Own<capnp::ClientHook>_>
               ::operator()<>);
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00620d98;
    this_00[1].dependency.disposer = pDVar9;
    this_00[1].dependency.ptr = (PromiseNode *)pCVar4;
    local_b8.segment =
         (SegmentBuilder *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,kj::_::Void,kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::PromiseClient::resolve(kj::Own<capnp::ClientHook>,bool)::{lambda(kj::Own<capnp::ClientHook>&&)#1},kj::Own<capnp::ClientHook>>,kj::_::PropagateException>>
          ::instance;
    local_b8.capTable = (CapTableBuilder *)this_00;
    OVar24 = newLocalPromiseClient
                       ((capnp *)&local_d8,(Promise<kj::Own<capnp::ClientHook>_> *)&local_b8);
    pDVar9 = replacement->disposer;
    pCVar4 = replacement->ptr;
    *(undefined4 *)&replacement->disposer = (undefined4)local_d8;
    *(undefined4 *)((long)&replacement->disposer + 4) = local_d8._4_4_;
    *(undefined4 *)&replacement->ptr = (undefined4)uStack_d0;
    *(undefined4 *)((long)&replacement->ptr + 4) = uStack_d0._4_4_;
    uStack_d0 = (SegmentBuilder *)0x0;
    if ((pCVar4 != (ClientHook *)0x0) &&
       ((**pDVar9->_vptr_Disposer)
                  (pDVar9,(_func_int *)
                          ((long)&pCVar4->_vptr_ClientHook + (long)pCVar4->_vptr_ClientHook[-2]),
                   OVar24.ptr), pSVar19 = uStack_d0, uStack_d0 != (SegmentBuilder *)0x0)) {
      uStack_d0 = (SegmentBuilder *)0x0;
      (*(code *)((Own<kj::PromiseFulfiller<void>_> *)&(local_d8->super_SegmentReader).arena)->
                disposer->_vptr_Disposer)
                (local_d8,(long)((Own<kj::PromiseFulfiller<void>_> *)
                                &(pSVar19->super_SegmentReader).arena)->disposer[-2]._vptr_Disposer
                          + (long)pSVar19 + 0x50 + -0x50);
    }
    (**(code **)(*local_98 + 8))();
    pCVar15 = local_b8.capTable;
    if ((TransformPromiseNodeBase *)local_b8.capTable != (TransformPromiseNodeBase *)0x0) {
      local_b8.capTable = (CapTableBuilder *)0x0;
      (*(code *)(((local_b8.segment)->super_SegmentReader).arena)->_vptr_Arena)
                (local_b8.segment,
                 (_func_int *)
                 ((long)&((PromiseNode *)&pCVar15->super_CapTableReader)->_vptr_PromiseNode +
                 (long)((PromiseNode *)&pCVar15->super_CapTableReader)->_vptr_PromiseNode[-2]));
    }
    pWVar16 = local_108.pointers;
    if (local_108.pointers != (WirePointer *)0x0) {
      local_108.pointers = (WirePointer *)0x0;
      (*(code *)(*(Disposer **)local_108.data)->_vptr_Disposer)
                (local_108.data,
                 (long)&(pWVar16->offsetAndKind).value + *(long *)((long)*pWVar16 + -0x10));
    }
    pCVar15 = local_108.capTable;
    if ((SegmentBuilder *)local_108.capTable != (SegmentBuilder *)0x0) {
      local_108.capTable = (CapTableBuilder *)0x0;
      (*(code *)((Own<kj::PromiseFulfiller<void>_> *)
                &((local_108.segment)->super_SegmentReader).arena)->disposer->_vptr_Disposer)
                (local_108.segment,
                 (long)((Own<kj::PromiseFulfiller<void>_> *)
                       &((SegmentReader *)&pCVar15->super_CapTableReader)->arena)->disposer[-2].
                       _vptr_Disposer + (long)pCVar15 + 0x50 + -0x50);
    }
    plVar17 = local_98;
    if (local_98 != (long *)0x0) {
      local_98 = (long *)0x0;
      (**(code **)*local_a0)(local_a0,(long)plVar17 + *(long *)(*plVar17 + -0x10));
    }
  }
  pDVar9 = (this->cap).disposer;
  pCVar4 = (this->cap).ptr;
  uVar11 = *(undefined4 *)((long)&replacement->disposer + 4);
  uVar12 = *(undefined4 *)&replacement->ptr;
  uVar13 = *(undefined4 *)((long)&replacement->ptr + 4);
  *(undefined4 *)&(this->cap).disposer = *(undefined4 *)&replacement->disposer;
  *(undefined4 *)((long)&(this->cap).disposer + 4) = uVar11;
  *(undefined4 *)&(this->cap).ptr = uVar12;
  *(undefined4 *)((long)&(this->cap).ptr + 4) = uVar13;
  replacement->ptr = (ClientHook *)0x0;
  if (pCVar4 != (ClientHook *)0x0) {
    (**pDVar9->_vptr_Disposer)
              (pDVar9,(_func_int *)
                      ((long)&pCVar4->_vptr_ClientHook + (long)pCVar4->_vptr_ClientHook[-2]));
  }
  this->isResolved = true;
  return;
}

Assistant:

void resolve(kj::Own<ClientHook> replacement, bool isError) {
      const void* replacementBrand = replacement->getBrand();
      if (replacementBrand != connectionState.get() &&
          replacementBrand != &ClientHook::NULL_CAPABILITY_BRAND &&
          receivedCall && !isError && connectionState->connection.is<Connected>()) {
        // The new capability is hosted locally, not on the remote machine.  And, we had made calls
        // to the promise.  We need to make sure those calls echo back to us before we allow new
        // calls to go directly to the local capability, so we need to set a local embargo and send
        // a `Disembargo` to echo through the peer.

        auto message = connectionState->connection.get<Connected>()->newOutgoingMessage(
            messageSizeHint<rpc::Disembargo>() + MESSAGE_TARGET_SIZE_HINT);

        auto disembargo = message->getBody().initAs<rpc::Message>().initDisembargo();

        {
          auto redirect = connectionState->writeTarget(*cap, disembargo.initTarget());
          KJ_ASSERT(redirect == nullptr,
                    "Original promise target should always be from this RPC connection.");
        }

        EmbargoId embargoId;
        Embargo& embargo = connectionState->embargoes.next(embargoId);

        disembargo.getContext().setSenderLoopback(embargoId);

        auto paf = kj::newPromiseAndFulfiller<void>();
        embargo.fulfiller = kj::mv(paf.fulfiller);

        // Make a promise which resolves to `replacement` as soon as the `Disembargo` comes back.
        auto embargoPromise = paf.promise.then(
            kj::mvCapture(replacement, [](kj::Own<ClientHook>&& replacement) {
              return kj::mv(replacement);
            }));

        // We need to queue up calls in the meantime, so we'll resolve ourselves to a local promise
        // client instead.
        replacement = newLocalPromiseClient(kj::mv(embargoPromise));

        // Send the `Disembargo`.
        message->send();
      }

      cap = kj::mv(replacement);
      isResolved = true;
    }